

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::FileDescriptor::dependency(FileDescriptor *this,int index)

{
  FileDescriptor *local_18;
  
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_18 = this;
    std::
    call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
              (*(once_flag **)(this + 0x18),DependenciesOnceInit,&local_18);
  }
  return *(FileDescriptor **)(*(long *)(this + 0x40) + (long)index * 8);
}

Assistant:

const FileDescriptor* FileDescriptor::dependency(int index) const {
  if (dependencies_once_) {
    // Do once init for all indices, as it's unlikely only a single index would
    // be called, and saves on internal::call_once allocations.
    internal::call_once(dependencies_once_->once,
                        FileDescriptor::DependenciesOnceInit, this);
  }
  return dependencies_[index];
}